

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaNf.c
# Opt level: O3

void Nf_ManComputeCuts(Nf_Man_t *p)

{
  uint uVar1;
  undefined8 uVar2;
  float *pfVar3;
  int *piVar4;
  Gia_Man_t *pGVar5;
  uint uVar6;
  int iVar7;
  ulong uVar8;
  ulong uVar9;
  long lVar10;
  
  pGVar5 = p->pGia;
  if (0 < pGVar5->nObjs) {
    lVar10 = 0;
    uVar9 = 0;
    do {
      if (pGVar5->pObjs == (Gia_Obj_t *)0x0) {
        return;
      }
      uVar2 = *(undefined8 *)(&pGVar5->pObjs->field_0x0 + lVar10);
      uVar6 = (uint)uVar2;
      if ((~uVar6 & 0x1fffffff) != 0 && -1 < (int)uVar6) {
        uVar6 = uVar6 & 0x1fffffff;
        if ((uVar6 == 0x1fffffff) || (uVar6 != ((uint)((ulong)uVar2 >> 0x20) & 0x1fffffff))) {
          Nf_ObjMergeOrder(p,(int)uVar9);
          pGVar5 = p->pGia;
        }
        else {
          iVar7 = (int)(-uVar6 + uVar9);
          if ((iVar7 < 0) || (uVar1 = (p->vCutFlows).nSize, (int)uVar1 <= iVar7)) {
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecFlt.h"
                          ,0x16e,"float Vec_FltEntry(Vec_Flt_t *, int)");
          }
          if (uVar1 <= uVar9) {
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecFlt.h"
                          ,0x184,"void Vec_FltWriteEntry(Vec_Flt_t *, int, float)");
          }
          uVar8 = -uVar6 + uVar9 & 0xffffffff;
          pfVar3 = (p->vCutFlows).pArray;
          pfVar3[uVar9] = pfVar3[uVar8];
          uVar6 = (p->vCutDelays).nSize;
          if ((int)uVar6 <= iVar7) {
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                          ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
          }
          if (uVar6 <= uVar9) {
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                          ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
          }
          piVar4 = (p->vCutDelays).pArray;
          piVar4[uVar9] = piVar4[uVar8];
        }
      }
      uVar9 = uVar9 + 1;
      lVar10 = lVar10 + 0xc;
    } while ((long)uVar9 < (long)pGVar5->nObjs);
  }
  return;
}

Assistant:

void Nf_ManComputeCuts( Nf_Man_t * p )
{
    Gia_Obj_t * pObj; int i, iFanin;
    Gia_ManForEachAnd( p->pGia, pObj, i )
        if ( Gia_ObjIsBuf(pObj) )
        {
            iFanin = Gia_ObjFaninId0(pObj, i);
            Nf_ObjSetCutFlow( p, i,  Nf_ObjCutFlow(p, iFanin) );
            Nf_ObjSetCutDelay( p, i, Nf_ObjCutDelay(p, iFanin) );
        }
        else
            Nf_ObjMergeOrder( p, i );
}